

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

bool icu_63::anon_unknown_1::equalStrings(UnicodeString *s1,UnicodeString *s2)

{
  UBool UVar1;
  UnicodeString *s2_local;
  UnicodeString *s1_local;
  
  if (s1 == (UnicodeString *)0x0) {
    s1_local._7_1_ = s2 == (UnicodeString *)0x0;
  }
  else if (s2 == (UnicodeString *)0x0) {
    s1_local._7_1_ = false;
  }
  else {
    UVar1 = UnicodeString::operator==(s1,s2);
    s1_local._7_1_ = UVar1 != '\0';
  }
  return s1_local._7_1_;
}

Assistant:

bool equalStrings(const UnicodeString *s1, const UnicodeString *s2) {
    if(s1 == nullptr) {
        return s2 == nullptr;
    } else if(s2 == nullptr) {
        return false;
    } else {
        return *s1 == *s2;
    }
}